

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall Js::LocalObjectAddressForSlot::IsInDeadZone(LocalObjectAddressForSlot *this)

{
  bool bVar1;
  Var aValue;
  RecyclableObject *this_00;
  ScriptContext *this_01;
  ScriptContext *scriptContext;
  RecyclableObject *obj;
  Var value;
  LocalObjectAddressForSlot *this_local;
  
  aValue = ScopeSlots::Get(&this->slotArray,this->slotIndex);
  bVar1 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar1) {
    this_00 = VarTo<Js::RecyclableObject>(aValue);
    this_01 = RecyclableObject::GetScriptContext(this_00);
    bVar1 = ScriptContext::IsUndeclBlockVar(this_01,this_00);
    this_local._4_4_ = (uint)bVar1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL LocalObjectAddressForSlot::IsInDeadZone() const
    {
        Var value = slotArray.Get(slotIndex);
        if (!VarIs<RecyclableObject>(value))
        {
            return FALSE;
        }

        RecyclableObject* obj = VarTo<RecyclableObject>(value);
        ScriptContext* scriptContext = obj->GetScriptContext();
        return scriptContext->IsUndeclBlockVar(obj) ? TRUE : FALSE;
    }